

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O2

int __thiscall geemuboi::core::CPU::add_hl_de(CPU *this)

{
  add_hl_r16(this,this->regs->d,this->regs->e);
  return 2;
}

Assistant:

int CPU::add_hl_de() {
    add_hl_r16(regs.d, regs.e);
    return 2;
}